

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O0

void __thiscall
Potassco::ProgramOptions::anon_unknown_15::CommandStringParser::~CommandStringParser
          (CommandStringParser *this)

{
  CommandStringParser *in_RDI;
  
  ~CommandStringParser(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

CommandStringParser(const char* cmd, ParseContext& ctx, unsigned flags)
		: CommandLineParser(ctx, flags)
		, cmd_(cmd ? cmd : "") {
		tok_.reserve(80);
	}